

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O3

void InstructionSet::x86::Primitive::
     add<true,unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (modify_t<unsigned_char> destination,read_t<unsigned_char> source,Context *context)

{
  byte bVar1;
  byte value;
  uint uVar2;
  undefined7 in_register_00000031;
  
  bVar1 = *destination;
  value = (bVar1 + source + '\x01') - ((context->flags).carry_ == 0);
  uVar2 = (uint)CONCAT71(in_register_00000031,source);
  (context->flags).carry_ = ((~(uint)value | bVar1 & uVar2) & (bVar1 | uVar2)) >> 7;
  (context->flags).auxiliary_carry_ = (uint)((byte)(*destination ^ source ^ value) >> 4 & 1);
  (context->flags).overflow_ = (uint)(~(*destination ^ source) & (*destination ^ value) & 0x80);
  Flags::
  set_from<unsigned_char,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,value);
  *destination = value;
  return;
}

Assistant:

void add(
	modify_t<IntT> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST + SRC [+ CF];
	*/
	/*
		The OF, SF, ZF, AF, CF, and PF flags are set according to the result.
	*/
	const IntT result = destination + source + (with_carry ? context.flags.template carry_bit<IntT>() : 0);

	context.flags.template set_from<Flag::Carry>(
		Numeric::carried_out<true, Numeric::bit_size<IntT>() - 1>(destination, source, result));
	context.flags.template set_from<Flag::AuxiliaryCarry>(
		Numeric::carried_in<4>(destination, source, result));
	context.flags.template set_from<Flag::Overflow>(
		Numeric::overflow<true, IntT>(destination, source, result));

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(result);

	destination = result;
}